

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O2

void Assimp::StandardShapes::MakeCone
               (ai_real height,ai_real radius1,ai_real radius2,uint tess,
               vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions,bool bOpen)

{
  undefined4 uVar1;
  pointer paVar2;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  aiVector3t<float> local_e8;
  float local_dc;
  float local_d8;
  float local_d4;
  aiVector3D v1;
  aiVector3D v4;
  aiVector3D v3;
  aiVector3D v2;
  
  if (height != 0.0 && 2 < tess) {
    uVar4 = ((long)(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(positions->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start) / 0xc;
    fVar10 = ABS(radius1);
    fVar8 = height * 0.5;
    fVar13 = ABS(radius2);
    if (fVar13 <= fVar10) {
      uVar7 = 0xffffffffffffffff;
      fVar14 = fVar13;
    }
    else {
      fVar8 = -fVar8;
      uVar7 = uVar4;
      fVar14 = fVar10;
      fVar10 = fVar13;
    }
    local_dc = 0.0;
    if ((fVar14 - fVar10) * 0.01 <= fVar10) {
      local_dc = fVar10;
    }
    iVar5 = 0;
    if (!bOpen) {
      iVar5 = tess * 3 << (local_dc != 0.0);
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (positions,uVar4 + (iVar5 + tess * 6));
    fVar13 = -fVar8;
    fVar18 = 0.0;
    local_d4 = 0.0;
    fVar10 = 1.0;
    while (local_d4 < 6.2831855) {
      fVar9 = local_dc * fVar10;
      fVar16 = local_dc * fVar18;
      v1._0_8_ = CONCAT44(fVar8,fVar9) ^ 0x8000000000000000;
      fVar17 = fVar10 * fVar14;
      fVar19 = fVar18 * fVar14;
      local_d4 = local_d4 + 6.2831855 / (float)tess;
      v1.z = fVar16;
      v2.x = fVar17;
      v2.y = fVar8;
      v2.z = fVar19;
      local_d8 = cosf(local_d4);
      fVar18 = sinf(local_d4);
      fVar11 = fVar14 * local_d8;
      fVar12 = local_dc * local_d8;
      fVar15 = local_dc * fVar18;
      v4.x = fVar12;
      v4.y = fVar13;
      v4.z = fVar15;
      v3.x = fVar11;
      v3.y = fVar8;
      v3.z = fVar14 * fVar18;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,&v1);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,&v2);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,&v3);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,&v4);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,&v1);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,&v3);
      fVar10 = local_d8;
      if (!bOpen) {
        local_e8.x = fVar17;
        local_e8.y = fVar8;
        local_e8.z = fVar19;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        emplace_back<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,
                   &local_e8);
        local_e8.x = fVar11;
        local_e8.y = fVar8;
        local_e8.z = fVar14 * fVar18;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        emplace_back<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,
                   &local_e8);
        local_e8.x = 0.0;
        local_e8.z = 0.0;
        local_e8.y = fVar8;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        emplace_back<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,
                   &local_e8);
        if ((local_dc != 0.0) || (fVar10 = local_d8, NAN(local_dc))) {
          local_e8.x = fVar9;
          local_e8.y = fVar13;
          local_e8.z = fVar16;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          emplace_back<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,
                     &local_e8);
          local_e8.x = fVar12;
          local_e8.y = fVar13;
          local_e8.z = fVar15;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          emplace_back<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,
                     &local_e8);
          local_e8.x = 0.0;
          local_e8.z = 0.0;
          local_e8.y = fVar13;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          emplace_back<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,
                     &local_e8);
          fVar10 = local_d8;
        }
      }
    }
    if (uVar7 != 0xffffffffffffffff) {
      lVar6 = uVar7 * 0xc;
      for (; paVar2 = (positions->
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)(((long)(positions->
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)paVar2) / 0xc);
          uVar7 = uVar7 + 3) {
        uVar1 = *(undefined4 *)((long)&paVar2->z + lVar6);
        uVar3 = *(undefined8 *)((long)&paVar2->x + lVar6);
        *(undefined8 *)((long)&paVar2->x + lVar6) = *(undefined8 *)((long)&paVar2[1].x + lVar6);
        *(undefined4 *)((long)&paVar2->z + lVar6) = *(undefined4 *)((long)&paVar2[1].z + lVar6);
        *(undefined8 *)((long)&paVar2[1].x + lVar6) = uVar3;
        *(undefined4 *)((long)&paVar2[1].z + lVar6) = uVar1;
        lVar6 = lVar6 + 0x24;
      }
    }
  }
  return;
}

Assistant:

void StandardShapes::MakeCone(ai_real height,ai_real radius1,
    ai_real radius2,unsigned int tess,
    std::vector<aiVector3D>& positions,bool bOpen /*= false */)
{
    // Sorry, a cone with less than 3 segments makes ABSOLUTELY NO SENSE
    if (tess < 3 || !height)
        return;

    size_t old = positions.size();

    // No negative radii
    radius1 = std::fabs(radius1);
    radius2 = std::fabs(radius2);

    ai_real halfHeight = height / ai_real(2.0);

    // radius1 is always the smaller one
    if (radius2 > radius1)
    {
        std::swap(radius2,radius1);
        halfHeight = -halfHeight;
    }
    else old = SIZE_MAX;

    // Use a large epsilon to check whether the cone is pointy
    if (radius1 < (radius2-radius1)*10e-3)radius1 = 0.0;

    // We will need 3*2 verts per segment + 3*2 verts per segment
    // if the cone is closed
    const unsigned int mem = tess*6 + (!bOpen ? tess*3 * (radius1 ? 2 : 1) : 0);
    positions.reserve(positions.size () + mem);

    // Now construct all segments
    const ai_real angle_delta = (ai_real)AI_MATH_TWO_PI / tess;
    const ai_real angle_max   = (ai_real)AI_MATH_TWO_PI;

    ai_real s = 1.0; // std::cos(angle == 0);
    ai_real t = 0.0; // std::sin(angle == 0);

    for (ai_real angle = 0.0; angle < angle_max; )
    {
        const aiVector3D v1 = aiVector3D (s * radius1, -halfHeight, t * radius1 );
        const aiVector3D v2 = aiVector3D (s * radius2,  halfHeight, t * radius2 );

        const ai_real next = angle + angle_delta;
        ai_real s2 = std::cos(next);
        ai_real t2 = std::sin(next);

        const aiVector3D v3 = aiVector3D (s2 * radius2,  halfHeight, t2 * radius2 );
        const aiVector3D v4 = aiVector3D (s2 * radius1, -halfHeight, t2 * radius1 );

        positions.push_back(v1);
        positions.push_back(v2);
        positions.push_back(v3);
        positions.push_back(v4);
        positions.push_back(v1);
        positions.push_back(v3);

        if (!bOpen)
        {
            // generate the end 'cap'
            positions.push_back(aiVector3D(s * radius2,  halfHeight, t * radius2 ));
            positions.push_back(aiVector3D(s2 * radius2,  halfHeight, t2 * radius2 ));
            positions.push_back(aiVector3D(0.0, halfHeight, 0.0));


            if (radius1)
            {
                // generate the other end 'cap'
                positions.push_back(aiVector3D(s * radius1,  -halfHeight, t * radius1 ));
                positions.push_back(aiVector3D(s2 * radius1,  -halfHeight, t2 * radius1 ));
                positions.push_back(aiVector3D(0.0, -halfHeight, 0.0));

            }
        }
        s = s2;
        t = t2;
        angle = next;
    }

    // Need to flip face order?
    if ( SIZE_MAX != old )  {
        for (size_t p = old; p < positions.size();p += 3) {
            std::swap(positions[p],positions[p+1]);
        }
    }
}